

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O1

bool duckdb::Equals::Operation<float>(float *left,float *right)

{
  float input;
  float input_00;
  bool bVar1;
  
  input = *left;
  input_00 = *right;
  bVar1 = Value::IsNan<float>(input);
  if ((bVar1) && (bVar1 = Value::IsNan<float>(input_00), bVar1)) {
    return true;
  }
  return (bool)(-(input == input_00) & 1);
}

Assistant:

bool Equals::Operation(const float &left, const float &right) {
	return EqualsFloat<float>(left, right);
}